

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

RFile * open_existing_file(char *name,uint64_t *size,unsigned_long *mtime,unsigned_long *atime,
                          long *perms)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined1 local_d8 [8];
  stat statbuf;
  RFile *ret;
  int fd;
  long *perms_local;
  unsigned_long *atime_local;
  unsigned_long *mtime_local;
  uint64_t *size_local;
  char *name_local;
  
  iVar1 = open(name,0);
  if (iVar1 < 0) {
    name_local = (char *)0x0;
  }
  else {
    statbuf.__glibc_reserved[2] = (__syscall_slong_t)safemalloc(1,4,0);
    *(int *)statbuf.__glibc_reserved[2] = iVar1;
    if ((((size != (uint64_t *)0x0) || (mtime != (unsigned_long *)0x0)) ||
        (atime != (unsigned_long *)0x0)) || (perms != (long *)0x0)) {
      iVar1 = fstat(iVar1,(stat *)local_d8);
      __stream = _stderr;
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fprintf(__stream,"%s: stat: %s\n",name,pcVar3);
        memset(local_d8,0,0x90);
      }
      if (size != (uint64_t *)0x0) {
        *size = statbuf.st_rdev;
      }
      if (mtime != (unsigned_long *)0x0) {
        *mtime = statbuf.st_atim.tv_nsec;
      }
      if (atime != (unsigned_long *)0x0) {
        *atime = statbuf.st_blocks;
      }
      if (perms != (long *)0x0) {
        *perms = (ulong)(uint)statbuf.st_nlink;
      }
    }
    name_local = (char *)statbuf.__glibc_reserved[2];
  }
  return (RFile *)name_local;
}

Assistant:

RFile *open_existing_file(const char *name, uint64_t *size,
                          unsigned long *mtime, unsigned long *atime,
                          long *perms)
{
    int fd;
    RFile *ret;

    fd = open(name, O_RDONLY);
    if (fd < 0)
        return NULL;

    ret = snew(RFile);
    ret->fd = fd;

    if (size || mtime || atime || perms) {
        struct stat statbuf;
        if (fstat(fd, &statbuf) < 0) {
            fprintf(stderr, "%s: stat: %s\n", name, strerror(errno));
            memset(&statbuf, 0, sizeof(statbuf));
        }

        if (size)
            *size = statbuf.st_size;

        if (mtime)
            *mtime = statbuf.st_mtime;

        if (atime)
            *atime = statbuf.st_atime;

        if (perms)
            *perms = statbuf.st_mode;
    }

    return ret;
}